

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeFromInternal
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other,
          offset_in_RepeatedPtrFieldBase_to_subr inner_loop)

{
  int iVar1;
  long lVar2;
  void **ppvVar3;
  long in_RCX;
  code *in_RDX;
  long in_RSI;
  long in_RDI;
  int allocated_elems;
  void **new_elements;
  void **other_elements;
  int other_size;
  int in_stack_00000074;
  RepeatedPtrFieldBase *in_stack_00000078;
  code *local_70;
  
  iVar1 = *(int *)(in_RSI + 8);
  lVar2 = *(long *)(in_RSI + 0x10);
  ppvVar3 = InternalExtend(in_stack_00000078,in_stack_00000074);
  local_70 = in_RDX;
  if (((ulong)in_RDX & 1) != 0) {
    local_70 = *(code **)(in_RDX + *(long *)(in_RDI + in_RCX) + -1);
  }
  (*local_70)((long *)(in_RDI + in_RCX),ppvVar3,lVar2 + 8,iVar1,
              **(int **)(in_RDI + 0x10) - *(int *)(in_RDI + 8));
  *(int *)(in_RDI + 8) = iVar1 + *(int *)(in_RDI + 8);
  if (**(int **)(in_RDI + 0x10) < *(int *)(in_RDI + 8)) {
    **(undefined4 **)(in_RDI + 0x10) = *(undefined4 *)(in_RDI + 8);
  }
  return;
}

Assistant:

inline void RepeatedPtrFieldBase::MergeFromInternal(
    const RepeatedPtrFieldBase& other,
    void (RepeatedPtrFieldBase::*inner_loop)(void**, void**, int, int)) {
  // Note: wrapper has already guaranteed that other.rep_ != NULL here.
  int other_size = other.current_size_;
  void** other_elements = other.rep_->elements;
  void** new_elements = InternalExtend(other_size);
  int allocated_elems = rep_->allocated_size - current_size_;
  (this->*inner_loop)(new_elements, other_elements, other_size,
                      allocated_elems);
  current_size_ += other_size;
  if (rep_->allocated_size < current_size_) {
    rep_->allocated_size = current_size_;
  }
}